

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitRefTest
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,
          RefTest *curr)

{
  undefined1 local_88 [8];
  Cast cast;
  
  doCast<wasm::RefTest>((Cast *)local_88,this,curr);
  if (cast.state.
      super__Variant_base<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
      .
      super__Move_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
      .
      super__Copy_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
      .
      super__Move_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
      .
      super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
      .
      super__Variant_storage_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
      ._M_u._M_first._M_storage._M_storage[0x40] == '\0') {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_88;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&cast);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
              (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible,
               (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               ((long)&cast.state.
                       super__Variant_base<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                       .
                       super__Move_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                       .
                       super__Copy_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                       .
                       super__Move_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                       .
                       super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
               + 0x18));
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         cast.state.
         super__Variant_base<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
         .
         super__Move_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
         .
         super__Copy_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
         .
         super__Move_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
         .
         super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
         .
         super__Variant_storage_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
         ._M_u._48_8_;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)cast.state.
                 super__Variant_base<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                 .
                 super__Move_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                 .
                 super__Copy_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                 .
                 super__Move_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                 .
                 super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                 .
                 super__Variant_storage_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                 ._M_u._56_8_;
  }
  else {
    cast.state.
    super__Variant_base<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
    .
    super__Move_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
    .
    super__Copy_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
    .
    super__Move_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
    .
    super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
    .
    super__Variant_storage_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
    ._72_4_ = ZEXT14(cast.state.
                     super__Variant_base<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                     .
                     super__Move_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                     .
                     super__Copy_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                     .
                     super__Move_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                     .
                     super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                     .
                     super__Variant_storage_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                     ._M_u._M_first._M_storage._M_storage[0x40] == '\x01');
    Flow::Flow(__return_storage_ptr__,
               (Literal *)
               ((long)&cast.state.
                       super__Variant_base<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                       .
                       super__Move_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                       .
                       super__Copy_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                       .
                       super__Move_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                       .
                       super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
               + 0x48));
    Literal::~Literal((Literal *)
                      ((long)&cast.state.
                              super__Variant_base<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                              .
                              super__Move_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                              .
                              super__Copy_assign_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                              .
                              super__Move_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                              .
                              super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                      + 0x48));
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
  ::~_Variant_storage((_Variant_storage<false,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                       *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefTest(RefTest* curr) {
    NOTE_ENTER("RefTest");
    auto cast = doCast(curr);
    if (auto* breaking = cast.getBreaking()) {
      return *breaking;
    } else {
      return Literal(int32_t(bool(cast.getSuccess())));
    }
  }